

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O1

void dsdKernelCopyListPlusOne(Dsd_Node_t *p,Dsd_Node_t *First,Dsd_Node_t **ppList,int nListSize)

{
  ulong uVar1;
  
  if (nListSize + 1 == (int)p->nDecs) {
    *p->pDecs = First;
    if (0 < nListSize) {
      uVar1 = 0;
      do {
        p->pDecs[uVar1 + 1] = ppList[uVar1];
        uVar1 = uVar1 + 1;
      } while ((uint)nListSize != uVar1);
    }
    return;
  }
  __assert_fail("nListSize+1 == p->nDecs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdProc.c"
                ,0x5f1,
                "void dsdKernelCopyListPlusOne(Dsd_Node_t *, Dsd_Node_t *, Dsd_Node_t **, int)");
}

Assistant:

void dsdKernelCopyListPlusOne( Dsd_Node_t * p, Dsd_Node_t * First, Dsd_Node_t ** ppList, int nListSize )
{
    int i;
    assert( nListSize+1 == p->nDecs );
    p->pDecs[0] = First;
    for( i = 0; i < nListSize; i++ )
        p->pDecs[i+1] = ppList[i];
}